

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  TestMoreStuffImpl *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Client local_a8;
  TestMoreStuffImpl *local_90;
  undefined1 local_78 [24];
  Client cap;
  Reader params;
  TestMoreStuffImpl *this_local;
  CallFooWhenResolvedContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
  ::getParams((Reader *)&cap.field_0x10,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams::Reader::getCap
            ((Client *)(local_78 + 0x10),(Reader *)&cap.field_0x10);
  Capability::Client::whenResolved((Client *)local_78);
  capnproto_test::capnp::test::TestInterface::Client::Client(&local_a8,(Client *)(local_78 + 0x10));
  local_90 = this_local;
  kj::Promise<void>::
  then<capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0,kj::_::PropagateException>
            ((Promise<void> *)this,(Type *)local_78,(PropagateException *)&local_a8);
  callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)
  ::$_0::~__0((__0 *)&local_a8);
  kj::Promise<void>::~Promise((Promise<void> *)local_78);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)(local_78 + 0x10));
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }